

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RuntimeCharTrie::Match
          (RuntimeCharTrie *this,Char *input,CharCount inputLength,CharCount *inputOffset,
          RegexStats *stats)

{
  int local_44;
  RuntimeCharTrie *pRStack_40;
  int i;
  RuntimeCharTrie *curr;
  RegexStats *stats_local;
  CharCount *inputOffset_local;
  CharCount inputLength_local;
  Char *input_local;
  RuntimeCharTrie *this_local;
  
  pRStack_40 = this;
  do {
    if (pRStack_40->count == 0) {
      return true;
    }
    if (inputLength <= *inputOffset) {
      return false;
    }
    if (stats != (RegexStats *)0x0) {
      stats->numCompares = stats->numCompares + 1;
    }
    local_44 = 0;
    while (pRStack_40->children[local_44].c != input[*inputOffset]) {
      if ((ushort)input[*inputOffset] < (ushort)pRStack_40->children[local_44].c) {
        return false;
      }
      local_44 = local_44 + 1;
      if (pRStack_40->count <= local_44) {
        return false;
      }
    }
    *inputOffset = *inputOffset + 1;
    pRStack_40 = &pRStack_40->children[local_44].node;
  } while( true );
}

Assistant:

bool RuntimeCharTrie::Match
        (const Char* const input
            , const CharCount inputLength
            , CharCount& inputOffset
#if ENABLE_REGEX_CONFIG_OPTIONS
            , RegexStats* stats
#endif
            ) const
    {
        const RuntimeCharTrie* curr = this;
        while (true)
        {
            if (curr->count == 0)
                return true;
            if (inputOffset >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif

#if 0
            int l = 0;
            int h = curr->count - 1;
            while (true)
            {
                if (l > h)
                    return false;
                int m = (l + h) / 2;
                if (curr->children[m].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[m].node;
                    break;
                }
                else if (CTU(curr->children[m].c) < CTU(input[inputOffset]))
                    l = m + 1;
                else
                    h = m - 1;
            }
#else
            int i = 0;
            while (true)
            {
                if (curr->children[i].c == input[inputOffset])
                {
                    inputOffset++;
                    curr = &curr->children[i].node;
                    break;
                }
                else if (curr->children[i].c > input[inputOffset])
                    return false;
                else if (++i >= curr->count)
                    return false;
            }
#endif
        }
    }